

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::GetArrayCopy<aiVertexWeight>(aiVertexWeight **dest,ai_uint num)

{
  aiVertexWeight *__src;
  aiVertexWeight *__dest;
  
  __src = *dest;
  if (__src != (aiVertexWeight *)0x0) {
    __dest = (aiVertexWeight *)operator_new__((ulong)num << 3);
    *dest = __dest;
    memcpy(__dest,__src,(ulong)num << 3);
    return;
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}